

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong unaff_R15;
  size_t mask;
  bool bVar25;
  bool bVar26;
  byte bVar27;
  byte bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi;
  undefined1 auVar55 [16];
  vint4 bi_1;
  undefined1 auVar56 [16];
  vint4 ai;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint local_804;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar46._4_4_ = fVar1;
  auVar46._0_4_ = fVar1;
  auVar46._8_4_ = fVar1;
  auVar46._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar47._4_4_ = fVar2;
  auVar47._0_4_ = fVar2;
  auVar47._8_4_ = fVar2;
  auVar47._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar48._4_4_ = fVar3;
  auVar48._0_4_ = fVar3;
  auVar48._8_4_ = fVar3;
  auVar48._12_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar49._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar49._8_4_ = -fVar1;
  auVar49._12_4_ = -fVar1;
  auVar50._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar50._8_4_ = -fVar2;
  auVar50._12_4_ = -fVar2;
  auVar51._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar51._8_4_ = -fVar3;
  auVar51._12_4_ = -fVar3;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar52._4_4_ = iVar4;
  auVar52._0_4_ = iVar4;
  auVar52._8_4_ = iVar4;
  auVar52._12_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar53._4_4_ = iVar4;
  auVar53._0_4_ = iVar4;
  auVar53._8_4_ = iVar4;
  auVar53._12_4_ = iVar4;
  local_804 = (uint)tray;
  puVar21 = local_7d0;
  do {
    puVar20 = puVar21;
    if (puVar20 == &local_7d8) break;
    puVar21 = puVar20 + -1;
    uVar23 = puVar20[-1];
    do {
      if ((uVar23 & 8) == 0) {
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar17),auVar49,auVar46);
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar18),auVar50,auVar47);
        auVar29 = vpmaxsd_avx(auVar29,auVar54);
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar19),auVar51,auVar48);
        auVar54 = vpmaxsd_avx(auVar54,auVar52);
        auVar29 = vpmaxsd_avx(auVar29,auVar54);
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar17 ^ 0x10)),auVar49,
                                  auVar46);
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar18 ^ 0x10)),auVar50,
                                  auVar47);
        auVar54 = vpminsd_avx(auVar54,auVar55);
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar19 ^ 0x10)),auVar51,
                                  auVar48);
        auVar55 = vpminsd_avx(auVar55,auVar53);
        auVar54 = vpminsd_avx(auVar54,auVar55);
        uVar11 = vpcmpd_avx512vl(auVar29,auVar54,2);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)((byte)uVar11 & 0xf));
      }
      if ((uVar23 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar16 = 4;
        }
        else {
          uVar22 = uVar23 & 0xfffffffffffffff0;
          lVar24 = 0;
          for (uVar23 = unaff_R15; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
            lVar24 = lVar24 + 1;
          }
          uVar16 = 0;
          uVar14 = unaff_R15 - 1 & unaff_R15;
          uVar23 = *(ulong *)(uVar22 + lVar24 * 8);
          if (uVar14 != 0) {
            *puVar21 = uVar23;
            while( true ) {
              puVar21 = puVar21 + 1;
              lVar24 = 0;
              for (uVar23 = uVar14; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                lVar24 = lVar24 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              uVar23 = *(ulong *)(uVar22 + lVar24 * 8);
              if (uVar14 == 0) break;
              *puVar21 = uVar23;
            }
          }
        }
      }
      else {
        uVar16 = 6;
      }
    } while (uVar16 == 0);
    if (uVar16 == 6) {
      uVar22 = (ulong)((uint)uVar23 & 0xf);
      uVar14 = uVar22 - 8;
      bVar25 = uVar22 != 8;
      if (bVar25) {
        uVar5 = *(undefined4 *)(ray + k * 4);
        auVar54._4_4_ = uVar5;
        auVar54._0_4_ = uVar5;
        auVar54._8_4_ = uVar5;
        auVar54._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar55._4_4_ = uVar5;
        auVar55._0_4_ = uVar5;
        auVar55._8_4_ = uVar5;
        auVar55._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar56._4_4_ = uVar5;
        auVar56._0_4_ = uVar5;
        auVar56._8_4_ = uVar5;
        auVar56._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar57._4_4_ = uVar5;
        auVar57._0_4_ = uVar5;
        auVar57._8_4_ = uVar5;
        auVar57._12_4_ = uVar5;
        uVar23 = uVar23 & 0xfffffffffffffff0;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar58._4_4_ = uVar5;
        auVar58._0_4_ = uVar5;
        auVar58._8_4_ = uVar5;
        auVar58._12_4_ = uVar5;
        auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar22 = 0;
        do {
          lVar24 = uVar22 * 0xb0;
          auVar43 = *(undefined1 (*) [16])(uVar23 + 0x80 + lVar24);
          auVar45 = *(undefined1 (*) [16])(uVar23 + 0x40 + lVar24);
          auVar44 = *(undefined1 (*) [16])(uVar23 + 0x70 + lVar24);
          auVar6 = *(undefined1 (*) [16])(uVar23 + 0x50 + lVar24);
          auVar30 = vmulps_avx512vl(auVar45,auVar43);
          auVar31 = vfmsub231ps_avx512vl(auVar30,auVar44,auVar6);
          auVar30 = *(undefined1 (*) [16])(uVar23 + 0x60 + lVar24);
          auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + lVar24),auVar54);
          auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x10 + lVar24),auVar55);
          auVar7 = *(undefined1 (*) [16])(uVar23 + 0x30 + lVar24);
          auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x20 + lVar24),auVar56);
          auVar35 = vmulps_avx512vl(auVar6,auVar30);
          auVar36 = vfmsub231ps_avx512vl(auVar35,auVar43,auVar7);
          auVar35 = vmulps_avx512vl(auVar7,auVar44);
          auVar37 = vfmsub231ps_avx512vl(auVar35,auVar30,auVar45);
          auVar35 = vmulps_avx512vl(auVar58,auVar34);
          auVar38 = vfmsub231ps_avx512vl(auVar35,auVar33,auVar29);
          auVar35 = vmulps_avx512vl(auVar29,auVar32);
          auVar39 = vfmsub231ps_avx512vl(auVar35,auVar34,auVar57);
          auVar35 = vmulps_avx512vl(auVar57,auVar33);
          auVar40 = vfmsub231ps_avx512vl(auVar35,auVar32,auVar58);
          auVar35 = vmulps_avx512vl(auVar37,auVar29);
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar36,auVar58);
          auVar41 = vfmadd231ps_avx512vl(auVar35,auVar31,auVar57);
          auVar35._8_4_ = 0x7fffffff;
          auVar35._0_8_ = 0x7fffffff7fffffff;
          auVar35._12_4_ = 0x7fffffff;
          auVar35 = vandps_avx512vl(auVar41,auVar35);
          auVar42._8_4_ = 0x80000000;
          auVar42._0_8_ = 0x8000000080000000;
          auVar42._12_4_ = 0x80000000;
          auVar42 = vandps_avx512vl(auVar41,auVar42);
          auVar43 = vmulps_avx512vl(auVar43,auVar40);
          auVar43 = vfmadd231ps_avx512vl(auVar43,auVar39,auVar44);
          auVar43 = vfmadd231ps_avx512vl(auVar43,auVar38,auVar30);
          auVar43 = vxorps_avx512vl(auVar42,auVar43);
          auVar44 = vmulps_avx512vl(auVar6,auVar40);
          auVar45 = vfmadd231ps_avx512vl(auVar44,auVar45,auVar39);
          auVar45 = vfmadd231ps_avx512vl(auVar45,auVar7,auVar38);
          auVar45 = vxorps_avx512vl(auVar42,auVar45);
          auVar44 = ZEXT816(0) << 0x20;
          uVar11 = vcmpps_avx512vl(auVar43,auVar44,5);
          uVar8 = vcmpps_avx512vl(auVar45,auVar44,5);
          uVar9 = vcmpps_avx512vl(auVar41,auVar44,4);
          auVar43 = vaddps_avx512vl(auVar43,auVar45);
          uVar10 = vcmpps_avx512vl(auVar43,auVar35,2);
          bVar27 = (byte)uVar11 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
          if (bVar27 == 0) {
            bVar26 = false;
          }
          else {
            auVar43 = vmulps_avx512vl(auVar37,auVar34);
            auVar43 = vfmadd213ps_avx512vl(auVar33,auVar36,auVar43);
            auVar43 = vfmadd213ps_avx512vl(auVar32,auVar31,auVar43);
            auVar44 = vxorps_avx512vl(auVar42,auVar43);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar43._4_4_ = uVar5;
            auVar43._0_4_ = uVar5;
            auVar43._8_4_ = uVar5;
            auVar43._12_4_ = uVar5;
            auVar43 = vmulps_avx512vl(auVar35,auVar43);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar45._4_4_ = uVar5;
            auVar45._0_4_ = uVar5;
            auVar45._8_4_ = uVar5;
            auVar45._12_4_ = uVar5;
            auVar45 = vmulps_avx512vl(auVar35,auVar45);
            uVar11 = vcmpps_avx512vl(auVar44,auVar45,2);
            uVar8 = vcmpps_avx512vl(auVar43,auVar44,1);
            bVar28 = (byte)uVar11 & (byte)uVar8;
            bVar26 = (bVar28 & bVar27) != 0;
            if (bVar26) {
              local_804 = (uint)(bVar28 & bVar27);
            }
          }
          if (bVar26) {
            uVar15 = (ulong)(byte)local_804;
            do {
              uVar12 = 0;
              for (uVar13 = uVar15; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                uVar12 = uVar12 + 1;
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar24 + uVar23 + 0x90 + uVar12 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) goto LAB_0075898a;
              uVar15 = uVar15 ^ 1L << (uVar12 & 0x3f);
            } while (uVar15 != 0);
          }
          uVar22 = uVar22 + 1;
          bVar25 = uVar22 < uVar14;
        } while (uVar22 != uVar14);
      }
LAB_0075898a:
      uVar16 = 0;
      if (bVar25) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar16 = 1;
      }
    }
  } while ((uVar16 & 3) == 0);
  return puVar20 != &local_7d8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }